

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_context_parse_spirv
          (spvc_context context,SpvId *spirv,size_t word_count,spvc_parsed_ir *parsed_ir)

{
  bool bVar1;
  spvc_parsed_ir_s *this;
  pointer psVar2;
  ParsedIR *other;
  pointer local_8e0;
  exception *e;
  undefined1 local_8a0 [8];
  Parser parser;
  string local_70;
  undefined1 local_39;
  unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_> local_38;
  unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_> pir;
  spvc_parsed_ir *parsed_ir_local;
  size_t word_count_local;
  SpvId *spirv_local;
  spvc_context context_local;
  
  pir._M_t.super___uniq_ptr_impl<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>._M_t.
  super__Tuple_impl<0UL,_spvc_parsed_ir_s_*,_std::default_delete<spvc_parsed_ir_s>_>.
  super__Head_base<0UL,_spvc_parsed_ir_s_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>,_true,_true>)
       (__uniq_ptr_data<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>,_true,_true>)
       parsed_ir;
  this = (spvc_parsed_ir_s *)operator_new(0x790,(nothrow_t *)&std::nothrow);
  local_39 = 0;
  local_8e0 = (pointer)0x0;
  if (this != (spvc_parsed_ir_s *)0x0) {
    local_39 = 1;
    spvc_parsed_ir_s::spvc_parsed_ir_s(this);
    local_8e0 = this;
  }
  std::unique_ptr<spvc_parsed_ir_s,std::default_delete<spvc_parsed_ir_s>>::
  unique_ptr<std::default_delete<spvc_parsed_ir_s>,void>
            ((unique_ptr<spvc_parsed_ir_s,std::default_delete<spvc_parsed_ir_s>> *)&local_38,
             local_8e0);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  if (bVar1) {
    psVar2 = std::unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>::operator->
                       (&local_38);
    psVar2->context = context;
    spirv_cross::Parser::Parser((Parser *)local_8a0,spirv,word_count);
    spirv_cross::Parser::parse((Parser *)local_8a0);
    other = spirv_cross::Parser::get_parsed_ir((Parser *)local_8a0);
    psVar2 = std::unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>::operator->
                       (&local_38);
    spirv_cross::ParsedIR::operator=(&psVar2->parsed,other);
    psVar2 = std::unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>::get
                       (&local_38);
    *(pointer *)
     pir._M_t.super___uniq_ptr_impl<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>._M_t.
     super__Tuple_impl<0UL,_spvc_parsed_ir_s_*,_std::default_delete<spvc_parsed_ir_s>_>.
     super__Head_base<0UL,_spvc_parsed_ir_s_*,_false>._M_head_impl = psVar2;
    std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
    unique_ptr<spvc_parsed_ir_s,std::default_delete<spvc_parsed_ir_s>,void>
              ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)
               &e,&local_38);
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&context->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
    ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    spirv_cross::Parser::~Parser((Parser *)local_8a0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"Out of memory.",
               (allocator *)(parser.forward_pointer_fixups.stack_storage.aligned_char + 0x3f));
    spvc_context_s::report_error(context,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator
              ((allocator<char> *)(parser.forward_pointer_fixups.stack_storage.aligned_char + 0x3f))
    ;
    context_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
  }
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x39] = '\0';
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x3a] = '\0';
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x3b] = '\0';
  parser.forward_pointer_fixups.stack_storage.aligned_char[0x38] = !bVar1;
  std::unique_ptr<spvc_parsed_ir_s,_std::default_delete<spvc_parsed_ir_s>_>::~unique_ptr(&local_38);
  if (parser.forward_pointer_fixups.stack_storage.aligned_char._56_4_ == 0) {
    context_local._4_4_ = SPVC_SUCCESS;
  }
  return context_local._4_4_;
}

Assistant:

spvc_result spvc_context_parse_spirv(spvc_context context, const SpvId *spirv, size_t word_count,
                                     spvc_parsed_ir *parsed_ir)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_parsed_ir_s> pir(new (std::nothrow) spvc_parsed_ir_s);
		if (!pir)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		pir->context = context;
		Parser parser(spirv, word_count);
		parser.parse();
		pir->parsed = std::move(parser.get_parsed_ir());
		*parsed_ir = pir.get();
		context->allocations.push_back(std::move(pir));
	}